

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

string * GetNonDefaultString<std::__cxx11::string>
                   (string *__return_storage_ptr__,char *name,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  uint *puVar1;
  ostream *poVar2;
  ostringstream ss;
  long local_198 [3];
  uint auStack_180 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar2 = std::operator<<((ostream *)local_198,"Control ");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2," is set to non-default value: ");
  poVar2 = std::operator<<(poVar2,(string *)value);
  std::operator<<(poVar2,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetNonDefaultString(
    const char* name,
    const T& value )
{
    std::ostringstream ss;
    ss << std::boolalpha;
    ss << "Control " << name << " is set to non-default value: " << value << "\n";
    return ss.str();
}